

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putRGBcontig8bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  uint uVar1;
  uint3 *puVar2;
  uint *puVar3;
  uint local_30;
  uint32_t _x;
  int samplesperpixel;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  uVar1 = (uint)img->samplesperpixel;
  _x = h;
  _y_local = cp;
  do {
    local_30 = w;
    if (_x == 0) {
      return;
    }
    for (; 7 < local_30; local_30 = local_30 - 8) {
      *_y_local = *(uint3 *)pp | 0xff000000;
      _y_local[1] = *(uint3 *)(pp + (int)uVar1) | 0xff000000;
      puVar2 = (uint3 *)((long)(pp + (int)uVar1) + (long)(int)uVar1);
      _y_local[2] = *puVar2 | 0xff000000;
      puVar2 = (uint3 *)((long)puVar2 + (long)(int)uVar1);
      _y_local[3] = *puVar2 | 0xff000000;
      puVar2 = (uint3 *)((long)puVar2 + (long)(int)uVar1);
      _y_local[4] = *puVar2 | 0xff000000;
      puVar2 = (uint3 *)((long)puVar2 + (long)(int)uVar1);
      _y_local[5] = *puVar2 | 0xff000000;
      puVar2 = (uint3 *)((long)puVar2 + (long)(int)uVar1);
      puVar3 = _y_local + 7;
      _y_local[6] = *puVar2 | 0xff000000;
      puVar2 = (uint3 *)((long)puVar2 + (long)(int)uVar1);
      _y_local = _y_local + 8;
      *puVar3 = *puVar2 | 0xff000000;
      pp = (uchar *)((long)puVar2 + (long)(int)uVar1);
    }
    if (local_30 != 0) {
      switch(local_30) {
      case 7:
        *_y_local = *(uint3 *)pp | 0xff000000;
        pp = pp + (int)uVar1;
        _y_local = _y_local + 1;
      case 6:
        *_y_local = *(uint3 *)pp | 0xff000000;
        pp = pp + (int)uVar1;
        _y_local = _y_local + 1;
      case 5:
        *_y_local = *(uint3 *)pp | 0xff000000;
        pp = pp + (int)uVar1;
        _y_local = _y_local + 1;
      case 4:
        *_y_local = *(uint3 *)pp | 0xff000000;
        pp = pp + (int)uVar1;
        _y_local = _y_local + 1;
      case 3:
        *_y_local = *(uint3 *)pp | 0xff000000;
        pp = pp + (int)uVar1;
        _y_local = _y_local + 1;
      case 2:
        *_y_local = *(uint3 *)pp | 0xff000000;
        pp = pp + (int)uVar1;
        _y_local = _y_local + 1;
      case 1:
        *_y_local = *(uint3 *)pp | 0xff000000;
        pp = pp + (int)uVar1;
        _y_local = _y_local + 1;
      }
    }
    _y_local = _y_local + toskew;
    pp = pp + (int)(uVar1 * fromskew);
    _x = _x - 1;
  } while( true );
}

Assistant:

DECLAREContigPutFunc(putRGBcontig8bittile)
{
    int samplesperpixel = img->samplesperpixel;

    (void)x;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        UNROLL8(w, NOP, *cp++ = PACK(pp[0], pp[1], pp[2]);
                pp += samplesperpixel);
        cp += toskew;
        pp += fromskew;
    }
}